

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBucket.cpp
# Opt level: O2

void __thiscall
Memory::HeapBucketGroup<MediumAllocationBlockAttributes>::Initialize
          (HeapBucketGroup<MediumAllocationBlockAttributes> *this,HeapInfo *heapInfo,uint sizeCat)

{
  HeapBucketT<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>::Initialize
            ((HeapBucketT<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_> *)this,
             heapInfo,sizeCat);
  HeapBucketT<Memory::SmallLeafHeapBlockT<MediumAllocationBlockAttributes>_>::Initialize
            (&(this->leafHeapBucket).
              super_HeapBucketT<Memory::SmallLeafHeapBlockT<MediumAllocationBlockAttributes>_>,
             heapInfo,sizeCat);
  HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>::
  Initialize((HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
              *)&this->smallNormalWithBarrierHeapBucket,heapInfo,sizeCat);
  HeapBucketT<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>::
  Initialize((HeapBucketT<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
              *)&this->smallFinalizableWithBarrierHeapBucket,heapInfo,sizeCat);
  HeapBucketT<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>_>::Initialize
            ((HeapBucketT<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>_> *)
             &this->finalizableHeapBucket,heapInfo,sizeCat);
  return;
}

Assistant:

void
HeapBucketGroup<TBlockAttributes>::Initialize(HeapInfo * heapInfo, uint sizeCat)
{
    heapBucket.Initialize(heapInfo, sizeCat);
    leafHeapBucket.Initialize(heapInfo, sizeCat);
#ifdef RECYCLER_WRITE_BARRIER
    smallNormalWithBarrierHeapBucket.Initialize(heapInfo, sizeCat);
    smallFinalizableWithBarrierHeapBucket.Initialize(heapInfo, sizeCat);
#endif
    finalizableHeapBucket.Initialize(heapInfo, sizeCat);
#ifdef RECYCLER_VISITED_HOST
    recyclerVisitedHostHeapBucket.Initialize(heapInfo, sizeCat);
#endif
}